

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::ComputeByteMap(Prog *this)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  Inst *pIVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ulong in_RCX;
  int foldhi;
  long lVar8;
  int foldlo;
  uint uVar9;
  int lo;
  int hi;
  int iVar10;
  char local_4aa [2];
  long local_4a8;
  ulong local_4a0;
  Prog *local_498;
  long local_490;
  ByteMapBuilder builder;
  
  builder.splits_.words_[0] = 0;
  builder.splits_.words_[1] = 0;
  builder.splits_.words_[2] = 0;
  builder.colormap_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.colormap_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.colormap_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.ranges_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.ranges_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.ranges_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.splits_.words_[3] = 0x8000000000000000;
  builder.colors_[0xff] = 0x100;
  builder.nextcolor_ = 0x101;
  lVar8 = 0;
  bVar5 = false;
  local_4a0 = 0;
  local_498 = this;
  do {
    if (local_498->size_ <= lVar8) {
      ByteMapBuilder::Build(&builder,local_498->bytemap_,&local_498->bytemap_range_);
      ByteMapBuilder::~ByteMapBuilder(&builder);
      return;
    }
    pIVar4 = (local_498->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar7 = pIVar4[lVar8].out_opcode_ & 7;
    local_4a8 = lVar8;
    if (uVar7 == 4) {
      uVar7 = pIVar4[lVar8].field_1.out1_;
      in_RCX = in_RCX & 0xffffffffffffff00;
      if ((uVar7 & 3) != 0 && (local_4a0 & 1) == 0) {
        ByteMapBuilder::Mark(&builder,10,10);
        ByteMapBuilder::Merge(&builder);
        uVar7 = pIVar4[lVar8].field_1.out1_;
        in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
        local_4a0 = in_RCX;
      }
      if ((uVar7 & 0x30) != 0 && !bVar5) {
        local_4aa[0] = '\x01';
        local_4aa[1] = '\0';
        lVar8 = 0;
        while (lVar8 != 2) {
          local_490 = lVar8;
          cVar3 = local_4aa[lVar8];
          iVar10 = 0;
          while (lo = iVar10, lo < 0x100) {
            iVar10 = lo;
            do {
              hi = iVar10;
              if (hi == 0xff) {
                iVar10 = 0x100;
                break;
              }
              iVar10 = hi + 1;
              bVar5 = IsWordChar((uint8_t)lo);
              bVar6 = IsWordChar((uint8_t)iVar10);
            } while (bVar5 == bVar6);
            bVar5 = IsWordChar((uint8_t)lo);
            if ((bool)cVar3 == bVar5) {
              ByteMapBuilder::Mark(&builder,lo,hi);
            }
          }
          ByteMapBuilder::Merge(&builder);
          lVar8 = local_490 + 1;
        }
        bVar5 = true;
      }
    }
    else if (uVar7 == 2) {
      bVar1 = pIVar4[lVar8].field_1.field_3.lo_;
      uVar9 = (uint)bVar1;
      bVar2 = pIVar4[lVar8].field_1.field_3.hi_;
      uVar7 = (uint)bVar2;
      ByteMapBuilder::Mark(&builder,(uint)bVar1,uVar7);
      if (((0x60 < bVar2) && (bVar1 < 0x7b)) &&
         ((pIVar4[local_4a8].field_1.field_3.hint_foldcase_ & 1) != 0)) {
        if (bVar1 < 0x62) {
          uVar9 = 0x61;
        }
        if (0x79 < bVar2) {
          uVar7 = 0x7a;
        }
        if (uVar9 <= uVar7) {
          ByteMapBuilder::Mark(&builder,uVar9 - 0x20,uVar7 - 0x20);
        }
      }
      if ((pIVar4[local_4a8].out_opcode_ & 8) == 0) {
        uVar7 = (local_498->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[local_4a8 + 1].
                out_opcode_;
        in_RCX = (ulong)uVar7;
        if (((uVar7 & 7) == 2) &&
           (uVar7 = uVar7 ^ pIVar4[local_4a8].out_opcode_, in_RCX = (ulong)uVar7, uVar7 < 0x10))
        goto LAB_001b9562;
      }
      ByteMapBuilder::Merge(&builder);
    }
LAB_001b9562:
    lVar8 = local_4a8 + 1;
  } while( true );
}

Assistant:

void Prog::ComputeByteMap() {
  // Fill in bytemap with byte classes for the program.
  // Ranges of bytes that are treated indistinguishably
  // will be mapped to a single byte class.
  ByteMapBuilder builder;

  // Don't repeat the work for ^ and $.
  bool marked_line_boundaries = false;
  // Don't repeat the work for \b and \B.
  bool marked_word_boundaries = false;

  for (int id = 0; id < size(); id++) {
    Inst* ip = inst(id);
    if (ip->opcode() == kInstByteRange) {
      int lo = ip->lo();
      int hi = ip->hi();
      builder.Mark(lo, hi);
      if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
        int foldlo = lo;
        int foldhi = hi;
        if (foldlo < 'a')
          foldlo = 'a';
        if (foldhi > 'z')
          foldhi = 'z';
        if (foldlo <= foldhi) {
          foldlo += 'A' - 'a';
          foldhi += 'A' - 'a';
          builder.Mark(foldlo, foldhi);
        }
      }
      // If this Inst is not the last Inst in its list AND the next Inst is
      // also a ByteRange AND the Insts have the same out, defer the merge.
      if (!ip->last() &&
          inst(id+1)->opcode() == kInstByteRange &&
          ip->out() == inst(id+1)->out())
        continue;
      builder.Merge();
    } else if (ip->opcode() == kInstEmptyWidth) {
      if (ip->empty() & (kEmptyBeginLine|kEmptyEndLine) &&
          !marked_line_boundaries) {
        builder.Mark('\n', '\n');
        builder.Merge();
        marked_line_boundaries = true;
      }
      if (ip->empty() & (kEmptyWordBoundary|kEmptyNonWordBoundary) &&
          !marked_word_boundaries) {
        // We require two batches here: the first for ranges that are word
        // characters, the second for ranges that are not word characters.
        for (bool isword : {true, false}) {
          int j;
          for (int i = 0; i < 256; i = j) {
            for (j = i + 1; j < 256 &&
                            Prog::IsWordChar(static_cast<uint8_t>(i)) ==
                                Prog::IsWordChar(static_cast<uint8_t>(j));
                 j++)
              ;
            if (Prog::IsWordChar(static_cast<uint8_t>(i)) == isword)
              builder.Mark(i, j - 1);
          }
          builder.Merge();
        }
        marked_word_boundaries = true;
      }
    }
  }

  builder.Build(bytemap_, &bytemap_range_);

  if (0) {  // For debugging, use trivial bytemap.
    LOG(ERROR) << "Using trivial bytemap.";
    for (int i = 0; i < 256; i++)
      bytemap_[i] = static_cast<uint8_t>(i);
    bytemap_range_ = 256;
  }
}